

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine.cpp
# Opt level: O2

Properties * __thiscall
QFontEngine::properties(Properties *__return_storage_ptr__,QFontEngine *this)

{
  Data *pDVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  undefined8 *puVar6;
  Properties *pPVar7;
  long in_FS_OFFSET;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  QArrayDataPointer<char> local_1b0;
  QArrayDataPointer<char> local_198;
  QArrayDataPointer<char> local_180;
  QArrayDataPointer<char> local_168;
  QArrayDataPointer<char> local_148;
  QStringBuilder<QByteArray,_char> local_128;
  QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray> local_108;
  QStringBuilder<QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray>,_char> local_d0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray>,_char>,_QByteArray>
  local_90;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar6 = &DAT_005f72c8;
  pPVar7 = __return_storage_ptr__;
  for (lVar5 = 0xe; lVar5 != 0; lVar5 = lVar5 + -1) {
    (pPVar7->postscriptName).d.d = (Data *)*puVar6;
    puVar6 = puVar6 + 1;
    pPVar7 = (Properties *)&(pPVar7->postscriptName).d.ptr;
  }
  (__return_storage_ptr__->copyright).d.d = (Data *)0x0;
  (__return_storage_ptr__->copyright).d.ptr = (char *)0x0;
  (__return_storage_ptr__->copyright).d.size = 0;
  QString::toUtf8_helper((QString *)&local_180);
  convertToPostscriptFontFamilyName((QByteArray *)&local_168,(QByteArray *)&local_180);
  local_128.a.d.size = local_168.size;
  local_128.a.d.ptr = local_168.ptr;
  local_128.a.d.d = local_168.d;
  local_168.d = (Data *)0x0;
  local_168.ptr = (char *)0x0;
  local_168.size = 0;
  local_128.b = '-';
  QByteArray::number((uint)&local_198,*(uint *)&(this->fontDef).field_0x60 >> 0x1c & 3);
  QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray>::QStringBuilder
            (&local_108,&local_128,(QByteArray *)&local_198);
  QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray>::QStringBuilder
            (&local_d0.a,&local_108);
  local_d0.b = '-';
  QByteArray::number((uint)&local_1b0,
                     (uint)((ulong)*(undefined8 *)&(this->fontDef).field_0x60 >> 0x28) & 0x3ff);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray>,_char>,_QByteArray>
  ::QStringBuilder(&local_90,&local_d0,(QByteArray *)&local_1b0);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray>,_char>,_QByteArray>
  ::convertTo<QByteArray>((QByteArray *)&local_148,&local_90);
  pDVar1 = local_148.d;
  local_148.d = (Data *)0x0;
  (__return_storage_ptr__->postscriptName).d.d = pDVar1;
  (__return_storage_ptr__->postscriptName).d.ptr = local_148.ptr;
  local_148.ptr = (char *)0x0;
  (__return_storage_ptr__->postscriptName).d.size = local_148.size;
  local_148.size = 0;
  QArrayDataPointer<char>::~QArrayDataPointer(&local_148);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray>,_char>,_QByteArray>
  ::~QStringBuilder(&local_90);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_1b0);
  QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray>::~QStringBuilder(&local_d0.a);
  QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray>::~QStringBuilder(&local_108);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_198);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_128);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_168);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_180);
  iVar2 = (*this->_vptr_QFontEngine[0x1e])(this);
  (__return_storage_ptr__->ascent).val = iVar2;
  iVar3 = (*this->_vptr_QFontEngine[0x20])(this);
  (__return_storage_ptr__->descent).val = iVar3;
  iVar4 = (*this->_vptr_QFontEngine[0x21])(this);
  (__return_storage_ptr__->leading).val = iVar4;
  (__return_storage_ptr__->emSquare).val = iVar2;
  (*this->_vptr_QFontEngine[0x26])(this);
  (__return_storage_ptr__->boundingBox).xp = 0.0;
  (__return_storage_ptr__->boundingBox).yp = (double)iVar2 * -0.015625;
  (__return_storage_ptr__->boundingBox).w = (qreal)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  (__return_storage_ptr__->boundingBox).h = (double)(iVar3 + iVar2) * 0.015625;
  (__return_storage_ptr__->italicAngle).val = 0;
  (__return_storage_ptr__->capHeight).val = iVar2;
  iVar2 = (*this->_vptr_QFontEngine[0x24])(this);
  (__return_storage_ptr__->lineWidth).val = iVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QFontEngine::Properties QFontEngine::properties() const
{
    Properties p;
    p.postscriptName =
            QFontEngine::convertToPostscriptFontFamilyName(fontDef.families.first().toUtf8()) + '-'
            + QByteArray::number(fontDef.style) + '-' + QByteArray::number(fontDef.weight);
    p.ascent = ascent();
    p.descent = descent();
    p.leading = leading();
    p.emSquare = p.ascent;
    p.boundingBox = QRectF(0, -p.ascent.toReal(), maxCharWidth(), (p.ascent + p.descent).toReal());
    p.italicAngle = 0;
    p.capHeight = p.ascent;
    p.lineWidth = lineThickness();
    return p;
}